

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ImGuiContext *pIVar5;
  int *__dest;
  uint uVar6;
  uint uVar7;
  ImGuiContext *ctx;
  uint uVar8;
  
  pIVar5 = GImGui;
  iVar2 = (GImGui->ItemFlagsStack).Size;
  if ((long)iVar2 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.h"
                  ,0x695,"T &ImVector<int>::back() [T = int]");
  }
  uVar6 = GImGui->CurrentItemFlags;
  if (uVar6 == (GImGui->ItemFlagsStack).Data[(long)iVar2 + -1]) {
    uVar7 = uVar6 | option;
    if (!enabled) {
      uVar7 = ~option & uVar6;
    }
    GImGui->CurrentItemFlags = uVar7;
    iVar3 = (pIVar5->ItemFlagsStack).Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        uVar6 = 8;
      }
      else {
        uVar6 = iVar3 / 2 + iVar3;
      }
      uVar8 = iVar2 + 1U;
      if ((int)(iVar2 + 1U) < (int)uVar6) {
        uVar8 = uVar6;
      }
      if (iVar3 < (int)uVar8) {
        if (pIVar5 != (ImGuiContext *)0x0) {
          piVar4 = &(pIVar5->IO).MetricsActiveAllocations;
          *piVar4 = *piVar4 + 1;
        }
        __dest = (int *)(*GImAllocatorAllocFunc)((ulong)uVar8 << 2,GImAllocatorUserData);
        piVar4 = (pIVar5->ItemFlagsStack).Data;
        if (piVar4 != (int *)0x0) {
          memcpy(__dest,piVar4,(long)(pIVar5->ItemFlagsStack).Size << 2);
          piVar4 = (pIVar5->ItemFlagsStack).Data;
          if ((piVar4 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar4,GImAllocatorUserData);
        }
        (pIVar5->ItemFlagsStack).Data = __dest;
        (pIVar5->ItemFlagsStack).Capacity = uVar8;
      }
    }
    (pIVar5->ItemFlagsStack).Data[(pIVar5->ItemFlagsStack).Size] = uVar7;
    (pIVar5->ItemFlagsStack).Size = (pIVar5->ItemFlagsStack).Size + 1;
    return;
  }
  __assert_fail("item_flags == g.ItemFlagsStack.back()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                ,0x199a,"void ImGui::PushItemFlag(ImGuiItemFlags, bool)");
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiItemFlags item_flags = g.CurrentItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    g.CurrentItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}